

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *p,Gia_PtrAre_t Sta)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  Gia_Man_t *pGVar7;
  ulong uVar8;
  Gia_StaAre_t *pSta;
  Gia_Man_t *pGVar9;
  Gia_Obj_t *pGVar10;
  uint uVar11;
  Vec_Int_t *pVVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  timespec ts;
  timespec local_40;
  
  iVar5 = p->nRecCalls + 1;
  p->nRecCalls = iVar5;
  if (iVar5 != 1000000) {
    pGVar7 = p->pNew;
    pVVar12 = pGVar7->vCis;
    uVar11 = pVVar12->nSize;
    if (0 < (long)(int)uVar11) {
      piVar3 = pVVar12->pArray;
      lVar14 = 0;
      do {
        iVar5 = piVar3[lVar14];
        if (((long)iVar5 < 0) || (pGVar7->nObjs <= iVar5)) goto LAB_006d5566;
        if (pGVar7->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar7->pObjs[iVar5].Value = 0;
        lVar14 = lVar14 + 1;
      } while ((int)uVar11 != lVar14);
    }
    pGVar9 = p->pAig;
    iVar5 = pGVar9->nRegs;
    if (0 < iVar5) {
      iVar13 = 0;
      do {
        iVar2 = pGVar9->vCos->nSize;
        uVar11 = (iVar2 - iVar5) + iVar13;
        if (((int)uVar11 < 0) || (iVar2 <= (int)uVar11)) goto LAB_006d5585;
        iVar5 = pGVar9->vCos->pArray[uVar11];
        lVar14 = (long)iVar5;
        if ((lVar14 < 0) || (pGVar9->nObjs <= iVar5)) goto LAB_006d5566;
        pGVar10 = pGVar9->pObjs;
        if (pGVar10 == (Gia_Obj_t *)0x0) break;
        if (1 < pGVar10[lVar14].Value) {
          Gia_ManIncrementTravId(p->pNew);
          if ((int)pGVar10[lVar14].Value < 0) goto LAB_006d55c3;
          pGVar7 = p->pNew;
          uVar11 = pGVar10[lVar14].Value >> 1;
          if (pGVar7->nObjs <= (int)uVar11) goto LAB_006d5566;
          Gia_ManAreMostUsedPi_rec(pGVar7,pGVar7->pObjs + uVar11);
          pGVar9 = p->pAig;
        }
        iVar13 = iVar13 + 1;
        iVar5 = pGVar9->nRegs;
      } while (iVar13 < iVar5);
      pGVar7 = p->pNew;
      pVVar12 = pGVar7->vCis;
      uVar11 = pVVar12->nSize;
    }
    uVar15 = 0;
    pGVar10 = (Gia_Obj_t *)0x0;
    do {
      iVar5 = pVVar12->pArray[uVar15];
      if (((long)iVar5 < 0) || (pGVar7->nObjs <= iVar5)) goto LAB_006d5566;
      if (pGVar7->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar7->pObjs + iVar5;
      if ((pGVar10 == (Gia_Obj_t *)0x0) || (pGVar10->Value < pGVar1->Value)) {
        pGVar10 = pGVar1;
      }
      uVar15 = uVar15 + 1;
    } while (uVar11 != uVar15);
    if ((pGVar10 == (Gia_Obj_t *)0x0) || (pGVar10->Value < 2)) {
      iVar5 = clock_gettime(3,&local_40);
      if (iVar5 < 0) {
        iVar5 = 1;
      }
      else {
        iVar5 = ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8) >> 7) -
                (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),0xc) >> 0x1f)) +
                (int)local_40.tv_sec * -1000000;
      }
      pSta = Gia_ManAreCreateStaNew(p);
      pSta->iPrev = Sta;
      if (p->fMiter != 0) {
        pGVar7 = p->pAig;
        uVar11 = pGVar7->vCos->nSize;
        uVar6 = uVar11 - pGVar7->nRegs;
        if (uVar6 != 0 && pGVar7->nRegs <= (int)uVar11) {
          uVar8 = 0;
          uVar15 = (ulong)uVar11;
          if ((int)uVar11 < 1) {
            uVar15 = uVar8;
          }
          do {
            if (uVar15 == uVar8) goto LAB_006d5585;
            iVar13 = pGVar7->vCos->pArray[uVar8];
            if (((long)iVar13 < 0) || (pGVar7->nObjs <= iVar13)) goto LAB_006d5566;
            if (pGVar7->pObjs == (Gia_Obj_t *)0x0) break;
            uVar11 = pGVar7->pObjs[iVar13].Value;
            if ((int)uVar11 < 0) {
LAB_006d55c3:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf2,"int Abc_Lit2Var(int)");
            }
            if (p->pNew->nObjs <= (int)(uVar11 >> 1)) goto LAB_006d5566;
            if (((uVar11 & 1) != 0) ||
               (((undefined1  [12])p->pNew->pObjs[uVar11 >> 1] &
                (undefined1  [12])0x1fffffff1fffffff) != (undefined1  [12])0x1fffffff1fffffff)) {
              p->iOutFail = (int)uVar8;
              p->fStopped = 1;
              if (p->pTarget == (Gia_StaAre_t *)0x0) {
                p->pTarget = pSta;
                return 1;
              }
              __assert_fail("p->pTarget == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                            ,0x617,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
            }
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
        }
      }
      p->fStopped = 0;
      Gia_ManAreCubeProcess(p,pSta);
      iVar13 = clock_gettime(3,&local_40);
      if (iVar13 < 0) {
        iVar13 = -1;
      }
      else {
        iVar13 = (int)(local_40.tv_nsec / 1000) + (int)local_40.tv_sec * 1000000;
      }
      p->timeCube = p->timeCube + iVar13 + iVar5;
      return p->fStopped;
    }
    if (-1 < (int)*(undefined8 *)pGVar10) {
      __assert_fail("pObj->fTerm",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1b8,"int Gia_ObjCioId(Gia_Obj_t *)");
    }
    uVar11 = (uint)((ulong)*(undefined8 *)pGVar10 >> 0x20);
    if ((p->vCiTfos->nSize <= (int)(uVar11 & 0x1fffffff)) ||
       (p->vCiLits->nSize <= (int)(uVar11 & 0x1fffffff))) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                    ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
    }
    lVar14 = *(long *)((long)p->vCiTfos->pArray + (ulong)(uVar11 << 3));
    pvVar4 = p->vCiLits->pArray[uVar11 & 0x1fffffff];
    if (*(int *)(lVar14 + 4) != *(int *)((long)pvVar4 + 4)) {
      __assert_fail("Vec_IntSize(vTfos) == Vec_IntSize(vLits)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                    ,0x622,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
    }
    if (0 < *(int *)(lVar14 + 4)) {
      lVar16 = 0;
      do {
        iVar5 = *(int *)(*(long *)(lVar14 + 8) + lVar16 * 4);
        if (((long)iVar5 < 0) || (p->pAig->nObjs <= iVar5)) goto LAB_006d5566;
        pGVar10 = p->pAig->pObjs;
        if (pGVar10 == (Gia_Obj_t *)0x0) break;
        if (*(int *)((long)pvVar4 + 4) <= lVar16) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pGVar10 = pGVar10 + iVar5;
        *(uint *)(*(long *)((long)pvVar4 + 8) + lVar16 * 4) = pGVar10->Value;
        uVar15 = *(ulong *)pGVar10;
        uVar11 = (uint)uVar15;
        uVar8 = uVar15 & 0x1fffffff;
        if (uVar8 == 0x1fffffff || (int)uVar11 < 0) {
          if ((int)uVar11 < 0 && (int)uVar8 != 0x1fffffff) {
            if ((int)pGVar10[-uVar8].Value < 0) goto LAB_006d55a4;
            uVar6 = pGVar10[-uVar8].Value ^ uVar11 >> 0x1d & 1;
          }
          else {
            uVar6 = 0;
            if ((uVar11 & 0x9fffffff) != 0x9fffffff) {
              __assert_fail("Gia_ObjIsCi(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                            ,0x62c,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
            }
          }
        }
        else {
          if ((int)pGVar10[-uVar8].Value < 0) goto LAB_006d55a4;
          uVar11 = (uint)(uVar15 >> 0x20);
          if ((int)pGVar10[-(ulong)(uVar11 & 0x1fffffff)].Value < 0) goto LAB_006d55a4;
          uVar6 = Gia_ManHashAnd(p->pNew,pGVar10[-uVar8].Value ^ (uint)(uVar15 >> 0x1d) & 1,
                                 pGVar10[-(ulong)(uVar11 & 0x1fffffff)].Value ^ uVar11 >> 0x1d & 1);
        }
        pGVar10->Value = uVar6;
        lVar16 = lVar16 + 1;
      } while (lVar16 < *(int *)(lVar14 + 4));
    }
    iVar5 = Gia_ManAreDeriveNexts_rec(p,Sta);
    if (iVar5 != 0) {
      return 1;
    }
    iVar5 = *(int *)(lVar14 + 4);
    if (0 < iVar5) {
      lVar16 = 0;
      do {
        iVar13 = *(int *)(*(long *)(lVar14 + 8) + lVar16 * 4);
        if (((long)iVar13 < 0) || (p->pAig->nObjs <= iVar13)) goto LAB_006d5566;
        pGVar10 = p->pAig->pObjs;
        if (pGVar10 == (Gia_Obj_t *)0x0) break;
        pGVar10 = pGVar10 + iVar13;
        uVar15 = *(ulong *)pGVar10;
        uVar11 = (uint)uVar15;
        uVar8 = uVar15 & 0x1fffffff;
        if (uVar8 == 0x1fffffff || (int)uVar11 < 0) {
          if ((int)uVar11 < 0 && (int)uVar8 != 0x1fffffff) {
            if ((int)pGVar10[-uVar8].Value < 0) goto LAB_006d55a4;
            pGVar10->Value = pGVar10[-uVar8].Value ^ uVar11 >> 0x1d & 1;
          }
          else {
            if ((uVar11 & 0x9fffffff) != 0x9fffffff) {
              __assert_fail("Gia_ObjIsCi(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaEra2.c"
                            ,0x63b,"int Gia_ManAreDeriveNexts_rec(Gia_ManAre_t *, Gia_PtrAre_t)");
            }
            pGVar10->Value = 1;
          }
        }
        else {
          if ((int)pGVar10[-uVar8].Value < 0) {
LAB_006d55a4:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf5,"int Abc_LitNotCond(int, int)");
          }
          uVar11 = (uint)(uVar15 >> 0x20);
          if ((int)pGVar10[-(ulong)(uVar11 & 0x1fffffff)].Value < 0) goto LAB_006d55a4;
          uVar11 = Gia_ManHashAnd(p->pNew,pGVar10[-uVar8].Value ^ (uint)(uVar15 >> 0x1d) & 1,
                                  pGVar10[-(ulong)(uVar11 & 0x1fffffff)].Value ^ uVar11 >> 0x1d & 1)
          ;
          pGVar10->Value = uVar11;
          iVar5 = *(int *)(lVar14 + 4);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < iVar5);
    }
    iVar5 = Gia_ManAreDeriveNexts_rec(p,Sta);
    if (iVar5 != 0) {
      return 1;
    }
    iVar5 = *(int *)(lVar14 + 4);
    if (0 < (long)iVar5) {
      pGVar7 = p->pAig;
      lVar14 = *(long *)(lVar14 + 8);
      lVar16 = 0;
      while( true ) {
        iVar13 = *(int *)(lVar14 + lVar16 * 4);
        if (((long)iVar13 < 0) || (pGVar7->nObjs <= iVar13)) break;
        pGVar10 = pGVar7->pObjs;
        if (pGVar10 == (Gia_Obj_t *)0x0) {
          return 0;
        }
        if (*(int *)((long)pvVar4 + 4) <= lVar16) {
LAB_006d5585:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        pGVar10[iVar13].Value = *(uint *)(*(long *)((long)pvVar4 + 8) + lVar16 * 4);
        lVar16 = lVar16 + 1;
        if (iVar5 == lVar16) {
          return 0;
        }
      }
LAB_006d5566:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
  }
  return 0;
}

Assistant:

int Gia_ManAreDeriveNexts_rec( Gia_ManAre_t * p, Gia_PtrAre_t Sta )
{
    Gia_Obj_t * pPivot;
    Vec_Int_t * vLits, * vTfos;
    Gia_Obj_t * pObj;
    int i;
    abctime clk;
    if ( ++p->nRecCalls == MAX_CALL_NUM )
        return 0;
    if ( (pPivot = Gia_ManAreMostUsedPi(p)) == NULL )
    {
        Gia_StaAre_t * pNew;
        clk = Abc_Clock();
        pNew = Gia_ManAreCreateStaNew( p );
        pNew->iPrev = Sta;
        p->fStopped = (p->fMiter && (Gia_ManCheckPOstatus(p) & 1));
        if ( p->fStopped )
        {
            assert( p->pTarget == NULL );
            p->pTarget = pNew;
            return 1;
        }
        Gia_ManAreCubeProcess( p, pNew );
        p->timeCube += Abc_Clock() - clk;
        return p->fStopped;
    }
    // remember values in the cone and perform update
    vTfos = Vec_VecEntryInt( p->vCiTfos, Gia_ObjCioId(pPivot) );
    vLits = Vec_VecEntryInt( p->vCiLits, Gia_ObjCioId(pPivot) );
    assert( Vec_IntSize(vTfos) == Vec_IntSize(vLits) );
    Gia_ManForEachObjVec( vTfos, p->pAig, pObj, i )
    {
        Vec_IntWriteEntry( vLits, i, pObj->Value );
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( p->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        else 
        {
            assert( Gia_ObjIsCi(pObj) );
            pObj->Value = 0;
        }
    }
    if ( Gia_ManAreDeriveNexts_rec( p, Sta ) )
        return 1;
    // compute different values
    Gia_ManForEachObjVec( vTfos, p->pAig, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( p->pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        else 
        {
            assert( Gia_ObjIsCi(pObj) );
            pObj->Value = 1;
        }
    }
    if ( Gia_ManAreDeriveNexts_rec( p, Sta ) )
        return 1;
    // reset the original values
    Gia_ManForEachObjVec( vTfos, p->pAig, pObj, i )
        pObj->Value = Vec_IntEntry( vLits, i );
    return 0;
}